

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O1

bool icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
               (UnicodeString *affixPattern,UnicodeSet *ignorables,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  undefined8 uVar5;
  UErrorCode *in_R8;
  AffixTag tag;
  AffixTag AVar6;
  AffixTag local_40;
  
  AVar6 = local_40;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 == 0) {
    bVar2 = true;
  }
  else {
    local_40._0_8_ = local_40._4_8_ << 0x20;
    local_40.type = AVar6.type;
    local_40.state = STATE_BASE;
    bVar2 = hasNext(&local_40,affixPattern);
    AVar6 = local_40;
    if (bVar2) {
      tag._8_8_ = affixPattern;
      tag.offset = local_40.state;
      tag.codePoint = local_40.type;
      uVar5 = local_40._0_8_;
      local_40 = AVar6;
      local_40 = nextToken((AffixUtils *)uVar5,tag,(UnicodeString *)status,in_R8);
      uVar5 = local_40._8_8_;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        do {
          if (local_40.type == TYPE_CODEPOINT) {
            UVar3 = UnicodeSet::contains(ignorables,local_40.codePoint);
            if (UVar3 == '\0') break;
          }
          bVar2 = hasNext(&local_40,affixPattern);
          if (!bVar2) break;
          AVar6._8_8_ = affixPattern;
          AVar6.offset = (int)uVar5;
          AVar6.codePoint = (int)((ulong)uVar5 >> 0x20);
          local_40 = nextToken((AffixUtils *)local_40._0_8_,AVar6,(UnicodeString *)status,in_R8);
          uVar5 = local_40._8_8_;
        } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
      }
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  return bVar2;
}

Assistant:

bool AffixUtils::containsOnlySymbolsAndIgnorables(const UnicodeString& affixPattern,
                                                  const UnicodeSet& ignorables, UErrorCode& status) {
    if (affixPattern.length() == 0) {
        return true;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type == TYPE_CODEPOINT && !ignorables.contains(tag.codePoint)) {
            return false;
        }
    }
    return true;
}